

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O2

int big_file_mpi_write_records
              (BigFile *bf,BigRecordType *rtype,ptrdiff_t offset,size_t size,void *buf,
              int concurrency,MPI_Comm comm)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  BigBlockPtr ptr;
  BigBlock block [1];
  BigArray array [1];
  
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    if (rtype->nfield <= uVar3) {
      return 0;
    }
    ptr.fileid = 0;
    ptr._4_4_ = 0;
    ptr.roffset = 0;
    ptr.aoffset = 0;
    iVar1 = big_record_view_field(rtype,(int)uVar3,array,size,buf);
    if (iVar1 != 0) {
      iVar1 = 0x277;
      goto LAB_00104fb5;
    }
    iVar1 = big_file_mpi_open_block(bf,block,*(char **)(rtype->fields->dtype + lVar4 + -8),comm);
    if (iVar1 != 0) {
      iVar1 = 0x27a;
      goto LAB_00104fb5;
    }
    iVar1 = big_block_seek(block,&ptr,offset);
    if (iVar1 != 0) break;
    iVar1 = big_block_mpi_write(block,&ptr,array,concurrency,comm);
    if (iVar1 != 0) {
      iVar1 = 0x280;
      goto LAB_00104f88;
    }
    iVar1 = big_block_mpi_close(block,comm);
    if (iVar1 != 0) {
      iVar1 = 0x283;
      goto LAB_00104fb5;
    }
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x20;
  }
  iVar1 = 0x27d;
LAB_00104f88:
  _big_file_raise((char *)0x0,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                  ,iVar1);
  iVar2 = big_block_mpi_close(block,comm);
  iVar1 = 0x289;
  if (iVar2 == 0) {
    return -1;
  }
LAB_00104fb5:
  _big_file_raise((char *)0x0,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                  ,iVar1);
  return -1;
}

Assistant:

int
big_file_mpi_write_records(BigFile * bf,
    const BigRecordType * rtype,
    ptrdiff_t offset,
    size_t size,
    const void * buf,
    int concurrency,
    MPI_Comm comm)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigArray array[1];
        BigBlock block[1];
        BigBlockPtr ptr = {0};

        /* rainwoodman: cast away the const. We don't really modify it.*/
        RAISEIF(0 != big_record_view_field(rtype, i, array, size, (void*) buf),
            ex_array,
            NULL);
        RAISEIF(0 != big_file_mpi_open_block(bf, block, rtype->fields[i].name, comm),
            ex_open,
            NULL);
        RAISEIF(0 != big_block_seek(block, &ptr, offset),
            ex_seek,
            NULL);
        RAISEIF(0 != big_block_mpi_write(block, &ptr, array, concurrency, comm),
            ex_write,
            NULL);
        RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
        continue;
        ex_write:
        ex_seek:
            RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
            return -1;
        ex_open:
        ex_close:
        ex_array:
            return -1;
    }
    return 0;
}